

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

bool pybind11::detail::apply_exception_translators
               (forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                *translators)

{
  _Fwd_list_node_base *p_Var1;
  _Fwd_list_node_base *p_Var2;
  exception_ptr last_exception;
  long local_40;
  long local_38 [2];
  
  std::current_exception();
  p_Var1 = (translators->
           super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
           )._M_impl._M_head._M_next;
  if (p_Var1 != (_Fwd_list_node_base *)0x0) {
    p_Var2 = p_Var1[1]._M_next;
    local_38[0] = local_40;
    if (local_40 != 0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    (*(code *)p_Var2)(local_38);
    if (local_38[0] != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  if (local_40 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return p_Var1 != (_Fwd_list_node_base *)0x0;
}

Assistant:

inline bool apply_exception_translators(std::forward_list<ExceptionTranslator> &translators) {
    auto last_exception = std::current_exception();

    for (auto &translator : translators) {
        try {
            translator(last_exception);
            return true;
        } catch (...) {
            last_exception = std::current_exception();
        }
    }
    return false;
}